

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::RandomUniformLikeLayerParams::RandomUniformLikeLayerParams
          (RandomUniformLikeLayerParams *this,RandomUniformLikeLayerParams *from)

{
  float fVar1;
  float fVar2;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__RandomUniformLikeLayerParams_00400ad8;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  fVar1 = from->minval_;
  fVar2 = from->maxval_;
  this->seed_ = from->seed_;
  this->minval_ = fVar1;
  this->maxval_ = fVar2;
  return;
}

Assistant:

RandomUniformLikeLayerParams::RandomUniformLikeLayerParams(const RandomUniformLikeLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&seed_, &from.seed_,
    static_cast<size_t>(reinterpret_cast<char*>(&maxval_) -
    reinterpret_cast<char*>(&seed_)) + sizeof(maxval_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.RandomUniformLikeLayerParams)
}